

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O2

executor * __thiscall
spdlog::logger::log_it_
          (executor *__return_storage_ptr__,logger *this,log_msg *log_msg,bool log_enabled,
          bool traceback_enabled)

{
  details::executor::executor(__return_storage_ptr__,this,log_msg,log_enabled,traceback_enabled);
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE SPDLOG_EXECUTOR_T logger::log_it_(const spdlog::details::log_msg &log_msg, bool log_enabled, bool traceback_enabled)
{
#ifdef SPDLOG_JSON_LOGGER
    return spdlog::details::executor(this, log_msg, log_enabled, traceback_enabled);
#else
    executor_callback(log_msg, log_enabled, traceback_enabled);
    return SPDLOG_EXECUTOR_T{};
#endif
}